

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O3

IterateResult __thiscall deqp::egl::MakeCurrentPerfCase::iterate(MakeCurrentPerfCase *this)

{
  EGLDisplay pvVar1;
  pointer ppvVar2;
  void *pvVar3;
  void *pvVar4;
  iterator __position;
  deUint32 dVar5;
  Library *pLVar6;
  deUint64 dVar7;
  deUint64 dVar8;
  int iVar9;
  bool bVar10;
  unsigned_long local_38;
  
  pLVar6 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  if ((this->m_samples).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->m_samples).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    logTestInfo(this);
  }
  pvVar1 = this->m_display;
  dVar7 = deGetMicroseconds();
  if (0 < (this->m_spec).iterationCount) {
    iVar9 = 0;
    do {
      dVar5 = deRandom_getUint32(&(this->m_rnd).m_rnd);
      ppvVar2 = (this->m_contexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      pvVar3 = ppvVar2[(ulong)dVar5 %
                       (ulong)((long)(this->m_contexts).
                                     super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)ppvVar2 >> 3)];
      dVar5 = deRandom_getUint32(&(this->m_rnd).m_rnd);
      ppvVar2 = (this->m_surfaces).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      pvVar4 = ppvVar2[(ulong)dVar5 %
                       (ulong)((long)(this->m_surfaces).
                                     super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)ppvVar2 >> 3)];
      (*pLVar6->_vptr_Library[0x27])(pLVar6,pvVar1,pvVar4,pvVar4,pvVar3);
      if ((this->m_spec).release == true) {
        (*pLVar6->_vptr_Library[0x27])(pLVar6,pvVar1,0,0,0);
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 < (this->m_spec).iterationCount);
  }
  dVar8 = deGetMicroseconds();
  local_38 = dVar8 - dVar7;
  __position._M_current =
       (this->m_samples).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_samples).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (&this->m_samples,__position,&local_38);
  }
  else {
    *__position._M_current = local_38;
    (this->m_samples).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  (*pLVar6->_vptr_Library[0x27])(pLVar6,pvVar1,0,0,0);
  dVar5 = (*pLVar6->_vptr_Library[0x1f])(pLVar6);
  eglu::checkError(dVar5,"eglMakeCurrent()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMakeCurrentPerfTests.cpp"
                   ,0x214);
  bVar10 = (this->m_spec).sampleCount !=
           (int)((ulong)((long)(this->m_samples).
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_samples).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3);
  if (!bVar10) {
    logResults(this);
  }
  return (uint)bVar10;
}

Assistant:

TestCase::IterateResult MakeCurrentPerfCase::iterate (void)
{
	const Library&	egl	= m_eglTestCtx.getLibrary();
	if (m_samples.size() == 0)
		logTestInfo();

	{
		EGLDisplay	display		= m_display;
		deUint64	beginTimeUs	= deGetMicroseconds();

		for (int iteration = 0; iteration < m_spec.iterationCount; iteration++)
		{
			EGLContext	context = m_contexts[m_rnd.getUint32() % m_contexts.size()];
			EGLSurface	surface	= m_surfaces[m_rnd.getUint32() % m_surfaces.size()];

			egl.makeCurrent(display, surface, surface, context);

			if (m_spec.release)
				egl.makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT);
		}

		m_samples.push_back(deGetMicroseconds() - beginTimeUs);

		egl.makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT);
		EGLU_CHECK_MSG(egl, "eglMakeCurrent()");
	}

	if ((int)m_samples.size() == m_spec.sampleCount)
	{
		logResults();
		return STOP;
	}
	else
		return CONTINUE;
}